

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

Vec_Ptr_t * populateSafetyAssertionVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode_00;
  Aig_Obj_t *Entry;
  Vec_Ptr_t *vAssertSafety;
  int assertSafetyCounter;
  int i;
  Abc_Obj_t *pNode;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  vAssertSafety._0_4_ = 0;
  p = Vec_PtrAlloc(100);
  for (vAssertSafety._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), vAssertSafety._4_4_ < iVar1;
      vAssertSafety._4_4_ = vAssertSafety._4_4_ + 1) {
    pNode_00 = Abc_NtkPo(pNtk,vAssertSafety._4_4_);
    iVar1 = nodeName_starts_with(pNode_00,"assert_safety");
    if ((iVar1 != 0) || (iVar1 = nodeName_starts_with(pNode_00,"Assert"), iVar1 != 0)) {
      Entry = Aig_ManCo(pAig,vAssertSafety._4_4_);
      Vec_PtrPush(p,Entry);
      vAssertSafety._0_4_ = (uint)vAssertSafety + 1;
    }
  }
  printf("Number of safety property found = %d\n",(ulong)(uint)vAssertSafety);
  return p;
}

Assistant:

Vec_Ptr_t * populateSafetyAssertionVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, assertSafetyCounter = 0;
    Vec_Ptr_t * vAssertSafety;

    vAssertSafety = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        //if( strstr( Abc_ObjName( pNode ), "Assert") != NULL )
        if( nodeName_starts_with( pNode, "assert_safety" ) || nodeName_starts_with( pNode, "Assert" ))
        {
            Vec_PtrPush( vAssertSafety, Aig_ManCo( pAig, i ) );
            assertSafetyCounter++;
        }
    printf("Number of safety property found = %d\n", assertSafetyCounter);
    return vAssertSafety;
}